

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O3

deUint32 tcu::packRGB999E5(Vec4 *color)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  uint uVar11;
  uint uVar13;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  float fVar15;
  float fVar16;
  float fVar17;
  
  fVar10 = color->m_data[2];
  fVar15 = 65408.0;
  if (fVar10 <= 65408.0) {
    fVar15 = fVar10;
  }
  fVar15 = (float)(-(uint)(0.0 < fVar10) & (uint)fVar15);
  uVar1 = *(ulong *)color->m_data;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar1;
  auVar12 = minps(_DAT_0037a8c0,auVar12);
  fVar16 = (float)(-(uint)(0.0 < (float)uVar1) & auVar12._0_4_);
  fVar17 = (float)(-(uint)(0.0 < (float)(uVar1 >> 0x20)) & auVar12._4_4_);
  fVar10 = (float)(~-(uint)(fVar15 <= fVar17) & (uint)fVar15 |
                  (uint)fVar17 & -(uint)(fVar15 <= fVar17));
  uVar8 = -(uint)(fVar10 <= fVar16);
  fVar10 = (float)(uVar8 & (uint)fVar16 | ~uVar8 & (uint)fVar10);
  fVar9 = logf(fVar10);
  fVar9 = floorf(fVar9 * 1.442695);
  iVar6 = -0x10;
  if (-0x10 < (int)fVar9) {
    iVar6 = (int)fVar9;
  }
  fVar9 = ldexpf(1.0,iVar6 + -8);
  fVar10 = floorf(fVar10 / fVar9 + 0.5);
  auVar14._4_4_ = fVar9;
  auVar14._0_4_ = fVar9;
  auVar14._8_4_ = fVar9;
  auVar14._12_4_ = fVar9;
  auVar2._4_4_ = fVar17;
  auVar2._0_4_ = fVar16;
  auVar2._8_8_ = 0;
  auVar12 = divps(auVar2,auVar14);
  fVar16 = floorf(auVar12._0_4_ + 0.5);
  fVar17 = floorf(auVar12._4_4_ + 0.5);
  uVar11 = (uint)fVar16;
  uVar13 = (uint)fVar17;
  uVar8 = uVar11;
  if (0x1fe < uVar11) {
    uVar8 = 0x1ff;
  }
  uVar7 = uVar13;
  if (0x1fe < uVar13) {
    uVar7 = 0x1ff;
  }
  fVar15 = floorf(fVar15 / fVar9 + 0.5);
  uVar3 = (uint)fVar15;
  uVar5 = 0x1ff;
  if (uVar3 < 0x1ff) {
    uVar5 = uVar3;
  }
  uVar4 = 0;
  if (-1 < (int)uVar3) {
    uVar4 = uVar5 << 0x12;
  }
  return ((uint)((int)fVar10 == 0x200) + iVar6) * 0x8000000 +
         (uVar4 | ~-(uint)((int)uVar13 < 0) & uVar7 << 9 | ~-(uint)((int)uVar11 < 0) & uVar8) +
         0x80000000;
}

Assistant:

deUint32 packRGB999E5 (const tcu::Vec4& color)
{
	const int	mBits	= 9;
	const int	eBits	= 5;
	const int	eBias	= 15;
	const int	eMax	= (1<<eBits)-1;
	const float	maxVal	= (float)(((1<<mBits) - 1) * (1<<(eMax-eBias))) / (float)(1<<mBits);

	float	rc		= deFloatClamp(color[0], 0.0f, maxVal);
	float	gc		= deFloatClamp(color[1], 0.0f, maxVal);
	float	bc		= deFloatClamp(color[2], 0.0f, maxVal);
	float	maxc	= de::max(rc, de::max(gc, bc));
	int		expp	= de::max(-eBias - 1, deFloorFloatToInt32(deFloatLog2(maxc))) + 1 + eBias;
	float	e		= deFloatPow(2.0f, (float)(expp-eBias-mBits));
	int		maxs	= deFloorFloatToInt32(maxc / e + 0.5f);

	deUint32	exps	= maxs == (1<<mBits) ? expp+1 : expp;
	deUint32	rs		= (deUint32)deClamp32(deFloorFloatToInt32(rc / e + 0.5f), 0, (1<<9)-1);
	deUint32	gs		= (deUint32)deClamp32(deFloorFloatToInt32(gc / e + 0.5f), 0, (1<<9)-1);
	deUint32	bs		= (deUint32)deClamp32(deFloorFloatToInt32(bc / e + 0.5f), 0, (1<<9)-1);

	DE_ASSERT((exps & ~((1<<5)-1)) == 0);
	DE_ASSERT((rs & ~((1<<9)-1)) == 0);
	DE_ASSERT((gs & ~((1<<9)-1)) == 0);
	DE_ASSERT((bs & ~((1<<9)-1)) == 0);

	return rs | (gs << 9) | (bs << 18) | (exps << 27);
}